

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetaobject.cpp
# Opt level: O0

QByteArray * __thiscall QMetaEnum::valueToKeys(QMetaEnum *this,quint64 value)

{
  bool bVar1;
  EnumExtendMode mode_00;
  qint32 qVar2;
  quint64 qVar3;
  quint64 in_RDX;
  QByteArray *in_RSI;
  QVarLengthArray<QByteArrayView,_32LL> *in_RDI;
  long in_FS_OFFSET;
  QByteArrayView QVar4;
  quint64 k;
  int i;
  quint64 v;
  EnumExtendMode mode;
  QByteArray *keys;
  QVarLengthArray<QByteArrayView,_32LL> parts;
  QByteArrayView *in_stack_fffffffffffffd28;
  QVarLengthArray<QByteArrayView,_32LL> *in_stack_fffffffffffffd30;
  Data *pDVar5;
  QMetaObject *mo;
  QVarLengthArray<QByteArrayView,_32LL> *this_00;
  undefined4 in_stack_fffffffffffffd64;
  undefined4 uVar6;
  QVarLengthArray<QByteArrayView,_32LL> *c;
  int local_274;
  ulong local_270;
  QVarLengthArray<QByteArrayView,_32LL> local_220;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  ((DataPointer *)&in_RDI->super_QVLABase<QByteArrayView>)->d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  ((DataPointer *)&in_RDI->super_QVLABase<QByteArrayView>)->ptr = &DAT_aaaaaaaaaaaaaaaa;
  ((DataPointer *)&in_RDI->super_QVLABase<QByteArrayView>)->size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  c = in_RDI;
  QByteArray::QByteArray((QByteArray *)0x365dbb);
  if ((in_RSI->d).d != (Data *)0x0) {
    mode_00 = enumExtendMode((QMetaEnum *)in_stack_fffffffffffffd30);
    bVar1 = isEnumValueSuitable(in_RDX,mode_00);
    uVar6 = CONCAT13(bVar1,(int3)in_stack_fffffffffffffd64);
    if (bVar1) {
      this_00 = &local_220;
      memset(this_00,0xaa,0x218);
      QVarLengthArray<QByteArrayView,_32LL>::QVarLengthArray(this_00);
      qVar2 = Data::keyCount((Data *)&(in_RSI->d).ptr);
      local_270 = in_RDX;
      local_274 = qVar2;
      while (local_274 = local_274 + -1, -1 < local_274) {
        qVar3 = value_helper<EnumExtendMode>
                          ((QMetaEnum *)CONCAT44(uVar6,qVar2),(uint)((ulong)this_00 >> 0x20),
                           (EnumExtendMode)this_00);
        if (((qVar3 != 0) && ((local_270 & qVar3) == qVar3)) || (qVar3 == in_RDX)) {
          local_270 = local_270 & ~qVar3;
          pDVar5 = (in_RSI->d).d;
          mo = *(QMetaObject **)&pDVar5[1].super_QArrayData;
          Data::data((Data *)&(in_RSI->d).ptr);
          QVar4 = stringDataView(mo,(int)((ulong)pDVar5 >> 0x20));
          in_stack_fffffffffffffd30 = (QVarLengthArray<QByteArrayView,_32LL> *)QVar4.m_data;
          QVarLengthArray<QByteArrayView,_32LL>::push_back
                    (in_stack_fffffffffffffd30,in_stack_fffffffffffffd28);
        }
      }
      (anonymous_namespace)::join_reversed<QByteArray,QVarLengthArray<QByteArrayView,32ll>,char>
                (in_RSI,c,(char)((ulong)in_RDI >> 0x38));
      QVarLengthArray<QByteArrayView,_32LL>::~QVarLengthArray(in_stack_fffffffffffffd30);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (QByteArray *)c;
  }
  __stack_chk_fail();
}

Assistant:

QByteArray QMetaEnum::valueToKeys(quint64 value) const
{
    QByteArray keys;
    if (!mobj)
        return keys;

    EnumExtendMode mode = enumExtendMode(*this);
    if (!isEnumValueSuitable(value, mode))
        return keys;

    QVarLengthArray<QByteArrayView, sizeof(int) * CHAR_BIT> parts;
    quint64 v = value;

    // reverse iterate to ensure values like Qt::Dialog=0x2|Qt::Window are processed first.
    for (int i = data.keyCount() - 1; i >= 0; --i) {
        quint64 k = value_helper(i, mode);
        if ((k != 0 && (v & k) == k) || (k == value)) {
            v = v & ~k;
            parts.push_back(stringDataView(mobj, mobj->d.data[data.data() + 2 * i]));
        }
    }
    join_reversed(keys, parts, '|');
    return keys;
}